

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bob.cpp
# Opt level: O0

void __thiscall Bob::ObliviousShuffle(Bob *this)

{
  Bob *this_local;
  
  BlindPermuteProgram(this);
  PermuteProgram(this);
  BlindPermuteData(this);
  PermuteData(this);
  LoadNextRandomPermutation(this);
  LoadNextShuffleVectors(this);
  return;
}

Assistant:

void Bob::ObliviousShuffle()
{
    BlindPermuteProgram();
    PermuteProgram();
    BlindPermuteData();
    PermuteData();
    LoadNextRandomPermutation();
    LoadNextShuffleVectors();
}